

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConsequenceFinder.cpp
# Opt level: O1

void __thiscall Saturation::ConsequenceFinder::onClauseRemoved(ConsequenceFinder *this,Clause *cl)

{
  uint uVar1;
  Literal **ppLVar2;
  uint uVar3;
  ulong n;
  ulong uVar4;
  Literal **ppLVar5;
  
  uVar3 = *(uint *)&cl->field_0x38 & 0xfffff;
  if (uVar3 != 0) {
    ppLVar2 = cl->_literals;
    uVar4 = (ulong)(uVar3 != 0);
    ppLVar5 = cl->_literals + uVar4;
    do {
      uVar1 = ((*ppLVar2)->super_Term)._functor;
      n = (ulong)uVar1;
      if ((*(byte *)(*(long *)(*(long *)(DAT_00b7e1b0 + 0x80) + n * 8) + 0x40) & 0x20) != 0) {
        if ((this->_redundant).super_Array<bool>._capacity <= n) {
          ::Lib::Array<bool>::expandToFit(&(this->_redundant).super_Array<bool>,n);
        }
        if ((this->_redundant).super_Array<bool>._array[n] == false) {
          indexClause(this,uVar1,cl,false);
        }
      }
      uVar1 = (uint)uVar4;
      ppLVar2 = ppLVar5;
      if (uVar3 <= uVar1) {
        ppLVar2 = (Literal **)0x0;
      }
      uVar4 = (ulong)(uVar1 + 1);
      ppLVar5 = ppLVar5 + 1;
    } while (uVar1 < uVar3);
  }
  return;
}

Assistant:

void ConsequenceFinder::onClauseRemoved(Clause* cl)
{
  TIME_TRACE(TimeTrace::CONSEQUENCE_FINDING);

  for (auto l : cl->iterLits()) {
    unsigned fn = l->functor();
    if(!env.signature->getPredicate(fn)->label()) {
      continue;
    }
    if(!_redundant[fn]) {
      indexClause(fn, cl, false);
    }
  }
}